

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ringbuf.c
# Opt level: O0

ringbuf * ringbuf_new(uint length)

{
  int iVar1;
  uint uVar2;
  ringbuf *rbuf;
  ringbuf *prStack_10;
  uint length_local;
  
  uVar2 = length - (length >> 1 & 0x55555555);
  uVar2 = (uVar2 & 0x33333333) + (uVar2 >> 2 & 0x33333333);
  if ((uVar2 + (uVar2 >> 4) & 0xf0f0f0f) * 0x1010101 >> 0x18 < 2) {
    prStack_10 = (ringbuf *)Zalloc((ulong)length * 8 + 0x118);
    if (prStack_10 == (ringbuf *)0x0) {
      prStack_10 = (ringbuf *)0x0;
    }
    else {
      iVar1 = os_semaphore_init(&(prStack_10->field_2).nfree,length);
      if (iVar1 == 0) {
        iVar1 = os_semaphore_init(&(prStack_10->field_3).nused,0);
        if (iVar1 == 0) {
          (prStack_10->field_0).read_pos = 0;
          (prStack_10->field_1).write_pos = 0;
          prStack_10->len = length;
          prStack_10->len_mask = (ulong)(length - 1);
          prStack_10->running = 1;
        }
        else {
          util_semaphore_destroy(&(prStack_10->field_2).nfree);
          free(prStack_10);
          prStack_10 = (ringbuf *)0x0;
        }
      }
      else {
        free(prStack_10);
        prStack_10 = (ringbuf *)0x0;
      }
    }
  }
  else {
    prStack_10 = (ringbuf *)0x0;
  }
  return prStack_10;
}

Assistant:

struct ringbuf *
ringbuf_new(unsigned length)
{
	LOG(4, NULL);

	/* length must be a power of two due to masking */
	if (util_popcount(length) > 1)
		return NULL;

	struct ringbuf *rbuf =
		Zalloc(sizeof(*rbuf) + (length * sizeof(void *)));
	if (rbuf == NULL)
		return NULL;

	if (os_semaphore_init(&rbuf->nfree, length)) {
		Free(rbuf);
		return NULL;
	}

	if (os_semaphore_init(&rbuf->nused, 0)) {
		util_semaphore_destroy(&rbuf->nfree);
		Free(rbuf);
		return NULL;
	}

	rbuf->read_pos = 0;
	rbuf->write_pos = 0;

	rbuf->len = length;
	rbuf->len_mask = length - 1;
	rbuf->running = 1;

	return rbuf;
}